

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O2

int __thiscall HttpHeaderBase::addFieldMap(HttpHeaderBase *this,FieldMap *fieldMap)

{
  int iVar1;
  FieldMap *fieldMap_local;
  
  if (fieldMap == (FieldMap *)0x0) {
    iVar1 = -1;
  }
  else {
    fieldMap_local = fieldMap;
    JetHead::list<FieldMap_*>::push_back(&this->mFieldMappings,&fieldMap_local);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int HttpHeaderBase::addFieldMap(FieldMap *fieldMap)
{
	TRACE_BEGIN(LOG_LVL_INFO);
	
	if (fieldMap == NULL)
		return -1;
	
	// Currently the assumption is that people adding field maps are doing
	// it in order.  ie.   HTTP->DLNA->DTV and that they want the mappings
	// searched in that order.  So mappings are appended to the tail as they
	// are added.
	mFieldMappings.push_back(fieldMap);
	return 0;
}